

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::Var::~Var(Var *this)

{
  Var *this_local;
  
  Destroy(this);
  return;
}

Assistant:

Var::~Var() {
  Destroy();
}